

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODCode93Reader.cpp
# Opt level: O2

Barcode * __thiscall
ZXing::OneD::Code93Reader::decodePattern
          (Barcode *__return_storage_ptr__,Code93Reader *this,int rowNumber,PatternView *next,
          unique_ptr<ZXing::OneD::RowReader::DecodingState,_std::default_delete<ZXing::OneD::RowReader::DecodingState>_>
          *param_3)

{
  Iterator puVar1;
  ushort uVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  allocator<char> local_145;
  int local_144;
  string txt;
  Error local_120;
  Error error;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c0;
  size_type local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  string local_a0;
  Error local_80;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [9];
  undefined4 local_37;
  undefined2 local_33;
  char local_31;
  
  FindLeftGuard<6,bool(*)(ZXing::PatternView_const&,int)>
            ((PatternView *)&error,(ZXing *)next,(PatternView *)0x1e,0x16efac,
             (_func_bool_PatternView_ptr_int *)param_3);
  next->_base = (Iterator)
                CONCAT71(error._msg.field_2._M_allocated_capacity._1_7_,
                         error._msg.field_2._M_local_buf[0]);
  next->_end = (Iterator)error._msg.field_2._8_8_;
  next->_data = (Iterator)error._msg._M_dataplus._M_p;
  *(size_type *)&next->_size = error._msg._M_string_length;
  bVar3 = PatternView::isValid(next);
  if (!bVar3) {
    memset(__return_storage_ptr__,0,0xd8);
    Result::Result(__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  local_144 = PatternView::pixelsInFront(next);
  txt._M_dataplus._M_p = (pointer)&txt.field_2;
  txt._M_string_length = 0;
  txt.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)&txt);
  do {
    if ((next->_data == (Iterator)0x0) ||
       (puVar1 = next->_data + next->_size, next->_data = puVar1, next->_end < puVar1 + next->_size)
       ) goto LAB_0016ee64;
    iVar4 = RowReader::OneToFourBitPattern<6,9>(next);
    RowReader::LookupBitPattern<int[48],char[49]>
              (iVar4,(int (*) [48])CHARACTER_ENCODINGS,
               (char (*) [49])"0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ-. $/+%abcd*");
    std::__cxx11::string::push_back((char)&txt);
    if (txt._M_dataplus._M_p[txt._M_string_length - 1] == '\0') goto LAB_0016ee64;
  } while (txt._M_dataplus._M_p[txt._M_string_length - 1] != '*');
  std::__cxx11::string::pop_back();
  if (2 < (int)txt._M_string_length) {
    next->_size = 7;
    bVar3 = PatternView::isValid(next);
    if (((bVar3) &&
        (uVar2 = next->_data[6], iVar4 = PatternView::sum(next,6), (int)(uint)uVar2 <= iVar4 / 4))
       && (bVar3 = PatternView::hasQuietZoneAfter<true>(next,0.5), bVar3)) {
      error._msg._M_dataplus._M_p = (pointer)&error._msg.field_2;
      error._msg._M_string_length = 0;
      error._msg.field_2._M_local_buf[0] = '\0';
      error._file = (char *)0x0;
      error._line = -1;
      error._type = None;
      iVar4 = (int)txt._M_string_length;
      bVar3 = CheckOneChecksum(&txt,(int)txt._M_string_length + -2,0x14);
      if ((!bVar3) || (bVar3 = CheckOneChecksum(&txt,iVar4 + -1,0xf), !bVar3)) {
        local_50 = local_40;
        local_120._msg._M_dataplus._M_p = (pointer)&local_120._msg.field_2;
        local_120._msg.field_2._M_local_buf[0] = '\0';
        local_120._msg.field_2._M_allocated_capacity._1_7_ = (undefined7)local_40._1_8_;
        local_120._msg.field_2._M_local_buf[8] = SUB81(local_40._1_8_,7);
        local_120._msg.field_2._9_4_ = local_37;
        local_120._msg.field_2._13_2_ = local_33;
        local_120._msg.field_2._M_local_buf[0xf] = local_31;
        local_120._msg._M_string_length = 0;
        local_48 = 0;
        local_40[0] = 0;
        local_120._file = "src/oned/ODCode93Reader.cpp";
        local_120._line = 0x77;
        local_120._type = Checksum;
        Error::operator=(&error,&local_120);
        std::__cxx11::string::~string((string *)&local_120);
        std::__cxx11::string::~string((string *)&local_50);
      }
      std::__cxx11::string::resize((ulong)&txt);
      if (error._type == None) {
        std::__cxx11::string::string((string *)&local_a0,(string *)&txt);
        DecodeCode39AndCode93FullASCII(&local_120._msg,&local_a0,"abcd");
        lVar5 = std::__cxx11::string::operator=((string *)&txt,(string *)&local_120);
        lVar5 = *(long *)(lVar5 + 8);
        std::__cxx11::string::~string((string *)&local_120);
        std::__cxx11::string::~string((string *)&local_a0);
        if (lVar5 == 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_c0,"ASCII decoding of Code93 failed",&local_145);
          local_120._msg._M_dataplus._M_p = (pointer)&local_120._msg.field_2;
          if (local_c0 == &local_b0) {
            local_120._msg.field_2._M_local_buf[8] = (char)local_b0._8_8_;
            local_120._msg.field_2._9_4_ = (undefined4)((ulong)local_b0._8_8_ >> 8);
            local_120._msg.field_2._13_2_ = (undefined2)((ulong)local_b0._8_8_ >> 0x28);
            local_120._msg.field_2._M_local_buf[0xf] = (char)((ulong)local_b0._8_8_ >> 0x38);
          }
          else {
            local_120._msg._M_dataplus._M_p = (pointer)local_c0;
          }
          local_120._msg.field_2._M_allocated_capacity._1_7_ = local_b0._M_allocated_capacity._1_7_;
          local_120._msg.field_2._M_local_buf[0] = local_b0._M_local_buf[0];
          local_120._msg._M_string_length = local_b8;
          local_b8 = 0;
          local_b0._M_local_buf[0] = '\0';
          local_120._file = "src/oned/ODCode93Reader.cpp";
          local_120._line = 0x7d;
          local_120._type = Format;
          local_c0 = &local_b0;
          Error::operator=(&error,&local_120);
          std::__cxx11::string::~string((string *)&local_120);
          std::__cxx11::string::~string((string *)&local_c0);
        }
      }
      iVar4 = PatternView::pixelsTillEnd(next);
      Error::Error(&local_80,&error);
      Result::Result(__return_storage_ptr__,&txt,rowNumber,local_144,iVar4,Code93,
                     (SymbologyIdentifier)0x3047,&local_80,false);
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::~string((string *)&error);
      goto LAB_0016ee7b;
    }
  }
LAB_0016ee64:
  memset(__return_storage_ptr__,0,0xd8);
  Result::Result(__return_storage_ptr__);
LAB_0016ee7b:
  std::__cxx11::string::~string((string *)&txt);
  return __return_storage_ptr__;
}

Assistant:

Barcode Code93Reader::decodePattern(int rowNumber, PatternView& next, std::unique_ptr<DecodingState>&) const
{
	// minimal number of characters that must be present (including start, stop, checksum and 1 payload characters)
	int minCharCount = 5;

	next = FindLeftGuard<CHAR_LEN>(next, minCharCount * CHAR_LEN, IsStartGuard);
	if (!next.isValid())
		return {};

	int xStart = next.pixelsInFront();

	std::string txt;
	txt.reserve(20);

	do {
		// check remaining input width
		if (!next.skipSymbol())
			return {};

		txt += LookupBitPattern(OneToFourBitPattern<CHAR_LEN, CHAR_SUM>(next), CHARACTER_ENCODINGS, ALPHABET);
		if (txt.back() == 0)
			return {};
	} while (txt.back() != '*');

	txt.pop_back(); // remove asterisk

	if (Size(txt) < minCharCount - 2)
		return {};

	// check termination bar (is present and not wider than about 2 modules) and quiet zone
	next = next.subView(0, CHAR_LEN + 1);
	if (!next.isValid() || next[CHAR_LEN] > next.sum(CHAR_LEN) / 4 || !next.hasQuietZoneAfter(QUIET_ZONE_SCALE))
		return {};

	Error error;
	if (!CheckChecksums(txt))
		error = ChecksumError();

	// Remove checksum digits
	txt.resize(txt.size() - 2);

	if (!error && (txt = DecodeCode39AndCode93FullASCII(txt, "abcd")).empty())
		error = FormatError("ASCII decoding of Code93 failed");

	// Symbology identifier ISO/IEC 15424:2008 4.4.10 no modifiers
	SymbologyIdentifier symbologyIdentifier = {'G', '0'};

	int xStop = next.pixelsTillEnd();
	return Barcode(txt, rowNumber, xStart, xStop, BarcodeFormat::Code93, symbologyIdentifier, error);
}